

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_test.cpp
# Opt level: O2

void * looper(void *param_1)

{
  int iVar1;
  int iVar2;
  uint i;
  int iVar3;
  bool bVar4;
  
  iVar3 = 0;
  do {
    if (iVar3 == 100000) {
      return (void *)0x0;
    }
    iVar2 = 0;
    LOCK();
    bVar4 = lock == 0;
    iVar1 = 1;
    if (!bVar4) {
      iVar2 = lock;
      iVar1 = lock;
    }
    lock = iVar1;
    UNLOCK();
    iVar1 = lock;
    while (!bVar4) {
      lock = iVar1;
      if (iVar2 == 2) {
LAB_00101211:
        syscall(0xca,&lock,0,2,0,0,0);
      }
      else {
        LOCK();
        iVar2 = 1;
        lock = 2;
        if (iVar1 != 1) {
          iVar2 = iVar1;
          lock = iVar1;
        }
        UNLOCK();
        if (iVar2 != 0) goto LAB_00101211;
      }
      iVar2 = 0;
      LOCK();
      bVar4 = lock == 0;
      iVar1 = 2;
      if (!bVar4) {
        iVar2 = lock;
        iVar1 = lock;
      }
      lock = iVar1;
      UNLOCK();
      iVar1 = lock;
    }
    global_variable = global_variable + 1;
    LOCK();
    lock = iVar1 + -1;
    UNLOCK();
    if (iVar1 == 2) {
      LOCK();
      lock = 0;
      UNLOCK();
      syscall(0xca,&lock,1,1,0,0,0);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static void *looper(void *)
{
	for (unsigned i = 0; i < num_iterations; i++)
	{
		Fossilize::futex_wrapper_lock(&lock);
		global_variable++;
		Fossilize::futex_wrapper_unlock(&lock);
	}
	return nullptr;
}